

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O2

ZyanStatus ZyanVectorReallocate(ZyanVector *vector,ZyanUSize capacity)

{
  ulong uVar1;
  ZyanAllocator_ *pZVar2;
  ZyanAllocatorAllocate p_Var3;
  uint __line;
  ZyanStatus ZVar4;
  ZyanStatus ZVar5;
  char *__assertion;
  
  uVar1 = vector->capacity;
  if (uVar1 == 0) {
    __assertion = "vector->capacity >= 1";
    __line = 0x57;
  }
  else if (vector->element_size == 0) {
    __assertion = "vector->element_size";
    __line = 0x58;
  }
  else {
    if (vector->data != (void *)0x0) {
      pZVar2 = vector->allocator;
      if (pZVar2 == (ZyanAllocator_ *)0x0) {
        ZVar5 = 0x100000;
        if (uVar1 < capacity) {
          ZVar5 = 0x80100009;
        }
      }
      else {
        p_Var3 = pZVar2->reallocate;
        if (p_Var3 == (ZyanAllocatorAllocate)0x0) {
          __assertion = "vector->allocator->reallocate";
          __line = 0x65;
          goto LAB_0010ce41;
        }
        if (capacity == 0) {
          if (uVar1 == 1) {
            return 0x100000;
          }
          capacity = 1;
        }
        vector->capacity = capacity;
        ZVar4 = (*p_Var3)(pZVar2,&vector->data,vector->element_size,capacity);
        ZVar5 = 0x100000;
        if ((int)ZVar4 < 0) {
          ZVar5 = ZVar4;
        }
      }
      return ZVar5;
    }
    __assertion = "vector->data";
    __line = 0x59;
  }
LAB_0010ce41:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                ,__line,"ZyanStatus ZyanVectorReallocate(ZyanVector *, ZyanUSize)");
}

Assistant:

static ZyanStatus ZyanVectorReallocate(ZyanVector* vector, ZyanUSize capacity)
{
    ZYAN_ASSERT(vector);
    ZYAN_ASSERT(vector->capacity >= ZYAN_VECTOR_MIN_CAPACITY);
    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    if (!vector->allocator)
    {
        if (vector->capacity < capacity)
        {
            return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
        }
        return ZYAN_STATUS_SUCCESS;
    }

    ZYAN_ASSERT(vector->allocator);
    ZYAN_ASSERT(vector->allocator->reallocate);

    if (capacity < ZYAN_VECTOR_MIN_CAPACITY)
    {
        if (vector->capacity > ZYAN_VECTOR_MIN_CAPACITY)
        {
            capacity = ZYAN_VECTOR_MIN_CAPACITY;
        } else
        {
            return ZYAN_STATUS_SUCCESS;
        }
    }

    vector->capacity = capacity;
    ZYAN_CHECK(vector->allocator->reallocate(vector->allocator, &vector->data,
        vector->element_size, vector->capacity));

    return ZYAN_STATUS_SUCCESS;
}